

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

hittable_list * cornell_smoke(void)

{
  hittable_list *in_RDI;
  vec3 local_448;
  undefined1 local_430 [24];
  shared_ptr<constant_medium> local_418;
  shared_ptr<hittable> local_408;
  vec3 local_3f8;
  undefined1 local_3e0 [24];
  shared_ptr<constant_medium> local_3c8;
  shared_ptr<hittable> local_3b8;
  vec3 local_3a8;
  shared_ptr<hittable> local_390;
  undefined4 local_37c;
  shared_ptr<hittable> local_378;
  vec3 local_368;
  vec3 local_350;
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  shared_ptr<hittable> box2;
  shared_ptr<hittable> local_300;
  undefined4 local_2ec;
  shared_ptr<hittable> local_2e8;
  vec3 local_2d8;
  vec3 local_2c0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  shared_ptr<hittable> box1;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  shared_ptr<xy_rect> local_270;
  shared_ptr<flip_face> local_260;
  shared_ptr<hittable> local_250;
  shared_ptr<lambertian> local_23c;
  int local_22c;
  shared_ptr<xz_rect> local_228;
  shared_ptr<hittable> local_218;
  shared_ptr<lambertian> local_204;
  int local_1f4;
  shared_ptr<xz_rect> local_1f0;
  shared_ptr<flip_face> local_1e0;
  shared_ptr<hittable> local_1d0;
  shared_ptr<diffuse_light> local_1bc;
  int local_1ac;
  shared_ptr<xz_rect> local_1a8;
  shared_ptr<hittable> local_198;
  shared_ptr<lambertian> local_184;
  int local_174;
  shared_ptr<yz_rect> local_170;
  shared_ptr<hittable> local_160;
  shared_ptr<lambertian> local_14c;
  int local_13c;
  shared_ptr<yz_rect> local_138;
  shared_ptr<flip_face> local_128;
  shared_ptr<hittable> local_118;
  vec3 local_108;
  undefined1 local_f0 [24];
  shared_ptr<diffuse_light> light;
  undefined1 local_b8 [24];
  shared_ptr<lambertian> green;
  undefined1 local_80 [24];
  shared_ptr<lambertian> white;
  vec3 local_50;
  undefined1 local_38 [24];
  shared_ptr<lambertian> red;
  hittable_list *objects;
  
  red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  hittable_list::hittable_list(in_RDI);
  vec3::vec3(&local_50,0.65,0.05,0.05);
  std::make_shared<constant_texture,vec3>((vec3 *)local_38);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_38 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_38);
  vec3::vec3((vec3 *)&green.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             0.73,0.73,0.73);
  std::make_shared<constant_texture,vec3>((vec3 *)local_80);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_80 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_80);
  vec3::vec3((vec3 *)&light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,0.12,0.45,0.15);
  std::make_shared<constant_texture,vec3>((vec3 *)local_b8);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_b8 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_b8);
  vec3::vec3(&local_108,7.0,7.0,7.0);
  std::make_shared<constant_texture,vec3>((vec3 *)local_f0);
  std::make_shared<diffuse_light,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_f0 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_f0);
  local_13c = 0;
  local_14c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x22b;
  local_14c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  local_14c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x22b;
  local_14c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x22b;
  std::make_shared<yz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_138,&local_13c,
             (int *)((long)&local_14c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_14c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_14c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_14c);
  std::make_shared<flip_face,std::shared_ptr<yz_rect>>((shared_ptr<yz_rect> *)&local_128);
  std::shared_ptr<hittable>::shared_ptr<flip_face,void>(&local_118,&local_128);
  hittable_list::add(in_RDI,&local_118);
  std::shared_ptr<hittable>::~shared_ptr(&local_118);
  std::shared_ptr<flip_face>::~shared_ptr(&local_128);
  std::shared_ptr<yz_rect>::~shared_ptr(&local_138);
  local_174 = 0;
  local_184.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x22b;
  local_184.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  local_184.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x22b;
  local_184.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  std::make_shared<yz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_170,&local_174,
             (int *)((long)&local_184.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_184.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_184.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_184);
  std::shared_ptr<hittable>::shared_ptr<yz_rect,void>(&local_160,&local_170);
  hittable_list::add(in_RDI,&local_160);
  std::shared_ptr<hittable>::~shared_ptr(&local_160);
  std::shared_ptr<yz_rect>::~shared_ptr(&local_170);
  local_1ac = 0x71;
  local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x1bb;
  local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       0x7f;
  local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x1b0;
  local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x22a;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((int *)&local_1a8,&local_1ac,
             (int *)((long)&local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_1bc);
  std::shared_ptr<hittable>::shared_ptr<xz_rect,void>(&local_198,&local_1a8);
  hittable_list::add(in_RDI,&local_198);
  std::shared_ptr<hittable>::~shared_ptr(&local_198);
  std::shared_ptr<xz_rect>::~shared_ptr(&local_1a8);
  local_1f4 = 0;
  local_204.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x22b;
  local_204.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  local_204.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x22b;
  local_204.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x22b;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_1f0,&local_1f4,
             (int *)((long)&local_204.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_204.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_204.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_204);
  std::make_shared<flip_face,std::shared_ptr<xz_rect>>((shared_ptr<xz_rect> *)&local_1e0);
  std::shared_ptr<hittable>::shared_ptr<flip_face,void>(&local_1d0,&local_1e0);
  hittable_list::add(in_RDI,&local_1d0);
  std::shared_ptr<hittable>::~shared_ptr(&local_1d0);
  std::shared_ptr<flip_face>::~shared_ptr(&local_1e0);
  std::shared_ptr<xz_rect>::~shared_ptr(&local_1f0);
  local_22c = 0;
  local_23c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x22b;
  local_23c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  local_23c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x22b;
  local_23c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_228,&local_22c,
             (int *)((long)&local_23c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_23c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_23c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_23c);
  std::shared_ptr<hittable>::shared_ptr<xz_rect,void>(&local_218,&local_228);
  hittable_list::add(in_RDI,&local_218);
  std::shared_ptr<hittable>::~shared_ptr(&local_218);
  std::shared_ptr<xz_rect>::~shared_ptr(&local_228);
  local_274 = 0;
  local_278 = 0x22b;
  local_27c = 0;
  local_280 = 0x22b;
  box1.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0x22b;
  std::make_shared<xy_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_270,&local_274,&stack0xfffffffffffffd88,&stack0xfffffffffffffd84,
             &stack0xfffffffffffffd80,
             (shared_ptr<lambertian> *)
             ((long)&box1.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             + 4));
  std::make_shared<flip_face,std::shared_ptr<xy_rect>>((shared_ptr<xy_rect> *)&local_260);
  std::shared_ptr<hittable>::shared_ptr<flip_face,void>(&local_250,&local_260);
  hittable_list::add(in_RDI,&local_250);
  std::shared_ptr<hittable>::~shared_ptr(&local_250);
  std::shared_ptr<flip_face>::~shared_ptr(&local_260);
  std::shared_ptr<xy_rect>::~shared_ptr(&local_270);
  vec3::vec3(&local_2c0,0.0,0.0,0.0);
  vec3::vec3(&local_2d8,165.0,330.0,165.0);
  std::make_shared<box,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_2a8,&local_2c0,(shared_ptr<lambertian> *)&local_2d8);
  std::shared_ptr<hittable>::shared_ptr<box,void>
            ((shared_ptr<hittable> *)local_298,(shared_ptr<box> *)local_2a8);
  std::shared_ptr<box>::~shared_ptr((shared_ptr<box> *)local_2a8);
  local_2ec = 0xf;
  std::make_shared<rotate_y,std::shared_ptr<hittable>&,int>(&local_2e8,(int *)local_298);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_298,(shared_ptr<rotate_y> *)&local_2e8);
  std::shared_ptr<rotate_y>::~shared_ptr((shared_ptr<rotate_y> *)&local_2e8);
  vec3::vec3((vec3 *)&box2.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             265.0,0.0,295.0);
  std::make_shared<translate,std::shared_ptr<hittable>&,vec3>(&local_300,(vec3 *)local_298);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_298,(shared_ptr<translate> *)&local_300);
  std::shared_ptr<translate>::~shared_ptr((shared_ptr<translate> *)&local_300);
  vec3::vec3(&local_350,0.0,0.0,0.0);
  vec3::vec3(&local_368,165.0,165.0,165.0);
  std::make_shared<box,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_338,&local_350,(shared_ptr<lambertian> *)&local_368);
  std::shared_ptr<hittable>::shared_ptr<box,void>
            ((shared_ptr<hittable> *)local_328,(shared_ptr<box> *)local_338);
  std::shared_ptr<box>::~shared_ptr((shared_ptr<box> *)local_338);
  local_37c = 0xffffffee;
  std::make_shared<rotate_y,std::shared_ptr<hittable>&,int>(&local_378,(int *)local_328);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_328,(shared_ptr<rotate_y> *)&local_378);
  std::shared_ptr<rotate_y>::~shared_ptr((shared_ptr<rotate_y> *)&local_378);
  vec3::vec3(&local_3a8,130.0,0.0,65.0);
  std::make_shared<translate,std::shared_ptr<hittable>&,vec3>(&local_390,(vec3 *)local_328);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_328,(shared_ptr<translate> *)&local_390);
  std::shared_ptr<translate>::~shared_ptr((shared_ptr<translate> *)&local_390);
  local_3e0._16_8_ = 0.01;
  vec3::vec3(&local_3f8,0.0,0.0,0.0);
  std::make_shared<constant_texture,vec3>((vec3 *)local_3e0);
  std::
  make_shared<constant_medium,std::shared_ptr<hittable>&,double,std::shared_ptr<constant_texture>>
            ((shared_ptr<hittable> *)&local_3c8,(double *)local_298,
             (shared_ptr<constant_texture> *)(local_3e0 + 0x10));
  std::shared_ptr<hittable>::shared_ptr<constant_medium,void>(&local_3b8,&local_3c8);
  hittable_list::add(in_RDI,&local_3b8);
  std::shared_ptr<hittable>::~shared_ptr(&local_3b8);
  std::shared_ptr<constant_medium>::~shared_ptr(&local_3c8);
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_3e0);
  local_430._16_8_ = 0.01;
  vec3::vec3(&local_448,1.0,1.0,1.0);
  std::make_shared<constant_texture,vec3>((vec3 *)local_430);
  std::
  make_shared<constant_medium,std::shared_ptr<hittable>&,double,std::shared_ptr<constant_texture>>
            ((shared_ptr<hittable> *)&local_418,(double *)local_328,
             (shared_ptr<constant_texture> *)(local_430 + 0x10));
  std::shared_ptr<hittable>::shared_ptr<constant_medium,void>(&local_408,&local_418);
  hittable_list::add(in_RDI,&local_408);
  std::shared_ptr<hittable>::~shared_ptr(&local_408);
  std::shared_ptr<constant_medium>::~shared_ptr(&local_418);
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_430);
  red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)local_328);
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)local_298);
  std::shared_ptr<diffuse_light>::~shared_ptr((shared_ptr<diffuse_light> *)(local_f0 + 0x10));
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)(local_b8 + 0x10));
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)(local_80 + 0x10));
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)(local_38 + 0x10));
  if ((red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1)
      == 0) {
    hittable_list::~hittable_list(in_RDI);
  }
  return in_RDI;
}

Assistant:

hittable_list cornell_smoke() {
    hittable_list objects;

    auto red = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.65, 0.05, 0.05)));
    auto white = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.73, 0.73, 0.73)));
    auto green = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.12, 0.45, 0.15)));
    auto light = make_shared<diffuse_light>(make_shared<constant_texture>(vec3(7, 7, 7)));

    objects.add(make_shared<flip_face>(make_shared<yz_rect>(0, 555, 0, 555, 555, green)));
    objects.add(make_shared<yz_rect>(0, 555, 0, 555, 0, red));
    objects.add(make_shared<xz_rect>(113, 443, 127, 432, 554, light));
    objects.add(make_shared<flip_face>(make_shared<xz_rect>(0, 555, 0, 555, 555, white)));
    objects.add(make_shared<xz_rect>(0, 555, 0, 555, 0, white));
    objects.add(make_shared<flip_face>(make_shared<xy_rect>(0, 555, 0, 555, 555, white)));

    shared_ptr<hittable> box1 = make_shared<box>(vec3(0,0,0), vec3(165,330,165), white);
    box1 = make_shared<rotate_y>(box1,  15);
    box1 = make_shared<translate>(box1, vec3(265,0,295));

    shared_ptr<hittable> box2 = make_shared<box>(vec3(0,0,0), vec3(165,165,165), white);
    box2 = make_shared<rotate_y>(box2, -18);
    box2 = make_shared<translate>(box2, vec3(130,0,65));

    objects.add(
            make_shared<constant_medium>(box1, 0.01, make_shared<constant_texture>(vec3(0,0,0))));
    objects.add(
            make_shared<constant_medium>(box2, 0.01, make_shared<constant_texture>(vec3(1,1,1))));

    return objects;
}